

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void PushWarnings(UniValue *warnings,UniValue *obj)

{
  long lVar1;
  pointer pcVar2;
  string key;
  UniValue val;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff48;
  VType VVar3;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 *puVar4;
  undefined8 in_stack_ffffffffffffff60;
  long in_stack_ffffffffffffff68;
  undefined1 auVar5 [32];
  undefined1 in_stack_ffffffffffffff70 [56];
  undefined1 *puVar6;
  undefined8 in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((warnings->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (warnings->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puVar6 = &stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffa8,"warnings","");
    VVar3 = warnings->typ;
    pcVar2 = (warnings->val)._M_dataplus._M_p;
    puVar4 = &stack0xffffffffffffff68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff58,pcVar2,pcVar2 + (warnings->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffff78,&warnings->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff90,
               &warnings->values);
    key._M_string_length._0_4_ = VVar3;
    key._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48;
    key._M_string_length._4_4_ = in_stack_ffffffffffffff54;
    key.field_2._M_allocated_capacity = (size_type)puVar4;
    key.field_2._8_8_ = in_stack_ffffffffffffff60;
    auVar5 = in_stack_ffffffffffffff70._0_32_;
    val.val._M_dataplus._M_p = (pointer)auVar5._0_8_;
    val.val._M_string_length = auVar5._8_8_;
    val.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar5._16_16_;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_ffffffffffffff70._32_24_;
    val._0_8_ = in_stack_ffffffffffffff68;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)puVar6;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffffb0;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffb8;
    UniValue::pushKV(obj,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff78);
    if (puVar4 != &stack0xffffffffffffff68) {
      operator_delete(puVar4,in_stack_ffffffffffffff68 + 1);
    }
    if (puVar6 != &stack0xffffffffffffffb8) {
      operator_delete(puVar6,(ulong)((long)&in_stack_ffffffffffffffb8->typ + 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PushWarnings(const UniValue& warnings, UniValue& obj)
{
    if (warnings.empty()) return;
    obj.pushKV("warnings", warnings);
}